

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O2

Vec3f getBarycentricCoordinates(Vec3f *AB,Vec3f *AC,Vec3f *PA)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Vec3f VVar5;
  
  VVar5.z = AB->x * AC->y - AB->y * AC->x;
  uVar1 = PA->x;
  uVar2 = PA->y;
  auVar3._0_4_ = AC->x * (float)uVar2 - AC->y * (float)uVar1;
  auVar3._4_4_ = AB->y * (float)uVar1 - (float)uVar2 * AB->x;
  auVar3._8_8_ = 0;
  auVar4._4_4_ = VVar5.z;
  auVar4._0_4_ = VVar5.z;
  auVar4._8_8_ = 0;
  auVar4 = divps(auVar3,auVar4);
  *in_RDI = 1.0 - (auVar3._4_4_ + auVar3._0_4_) / VVar5.z;
  VVar5._0_8_ = auVar4._0_8_;
  *(undefined8 *)(in_RDI + 1) = VVar5._0_8_;
  return VVar5;
}

Assistant:

Vec3f getBarycentricCoordinates(const Vec3f &AB, const Vec3f &AC, const Vec3f &PA){
    Vec3f vecX, vecY, coor;
    vecX = Vec3f(AB.x, AC.x, PA.x);
    vecY = Vec3f(AB.y, AC.y, PA.y);
    coor = vecX^vecY;
    return Vec3f((1.f - (coor.x + coor.y)/coor.z), (coor.x / coor.z), (coor.y / coor.z));
}